

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_normalize_space
              (lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  lys_node *plVar6;
  ulong uVar7;
  size_t __size;
  void *ptr;
  char *pcVar8;
  lyxp_set_node *plVar9;
  ushort uVar10;
  char *format;
  ushort uVar11;
  ulong uVar12;
  ly_ctx *ctx;
  byte bVar13;
  
  if ((options & 0x1cU) == 0) {
    if (arg_count != 0) {
      set_fill_set(set,*args);
    }
    iVar4 = lyxp_set_cast(set,LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar4 != 0) {
      return -1;
    }
    pcVar8 = (set->val).str;
    uVar5 = 0;
    bVar1 = false;
    do {
      uVar7 = (ulong)(uVar5 & 0xffff);
      uVar12 = (ulong)(byte)pcVar8[uVar7];
      bVar2 = false;
      if (uVar12 < 0x21) {
        if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
          if (uVar12 == 0) {
            return 0;
          }
        }
        else if (((uVar7 == 0) || (bVar1)) || (bVar2 = true, pcVar8[uVar7 + 1] == '\0'))
        goto LAB_00179a43;
      }
      bVar1 = bVar2;
      uVar5 = (uVar5 & 0xffff) + 1;
    } while( true );
  }
  iVar4 = 0;
  if (((arg_count != 0) && ((*args)->type == LYXP_SET_SNODE_SET)) &&
     (plVar6 = warn_get_snode_in_ctx(*args), plVar6 != (lys_node *)0x0)) {
    if ((plVar6->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      ctx = param_4->ctx;
      pcVar8 = strnodetype(plVar6->nodetype);
      format = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      iVar3 = warn_is_string_type((lys_type *)&plVar6[1].ref);
      if (iVar3 != 0) goto LAB_00179b02;
      ctx = param_4->ctx;
      pcVar8 = plVar6->name;
      format = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
    iVar4 = 1;
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_normalize_space",pcVar8);
  }
LAB_00179b02:
  set_snode_clear_ctx(set);
  return iVar4;
LAB_00179a43:
  __size = strlen(pcVar8);
  ptr = malloc(__size);
  if (ptr == (void *)0x0) {
LAB_00179b4d:
    ly_log(param_4->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_normalize_space")
    ;
    return -1;
  }
  uVar11 = 0;
  uVar10 = 0;
  bVar1 = false;
LAB_00179a65:
  bVar13 = pcVar8[uVar11];
  uVar7 = (ulong)bVar13;
  if (uVar7 < 0x21) {
    if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
      bVar1 = false;
      if (uVar7 != 0) goto LAB_00179aa7;
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        uVar7 = (ulong)*(byte *)((long)ptr + (ulong)(uVar10 - 1));
        if ((uVar7 < 0x21) && ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0)) {
          uVar10 = uVar10 - 1;
        }
      }
      plVar9 = (lyxp_set_node *)ly_realloc(ptr,(ulong)uVar10 + 1);
      if (plVar9 != (lyxp_set_node *)0x0) {
        *(undefined1 *)((long)&plVar9->node + (ulong)uVar10) = 0;
        free((set->val).nodes);
        (set->val).nodes = plVar9;
        return 0;
      }
      goto LAB_00179b4d;
    }
    bVar2 = !bVar1;
    bVar13 = 0x20;
    bVar1 = true;
    if (bVar2 && uVar11 != 0) goto LAB_00179aa7;
  }
  else {
    bVar1 = false;
LAB_00179aa7:
    *(byte *)((long)ptr + (ulong)uVar10) = bVar13;
    uVar10 = uVar10 + 1;
  }
  uVar11 = uVar11 + 1;
  goto LAB_00179a65;
}

Assistant:

static int
xpath_normalize_space(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                      struct lyxp_set *set, int options)
{
    uint16_t i, new_used;
    char *new;
    int have_spaces = 0, space_before = 0, ret = EXIT_SUCCESS;
    struct lys_node_leaf *sleaf;

    if (options & LYXP_SNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (arg_count) {
        set_fill_set(set, args[0]);
    }
    if (lyxp_set_cast(set, LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    /* is there any normalization necessary? */
    for (i = 0; set->val.str[i]; ++i) {
        if (is_xmlws(set->val.str[i])) {
            if ((i == 0) || space_before || (!set->val.str[i + 1])) {
                have_spaces = 1;
                break;
            }
            space_before = 1;
        } else {
            space_before = 0;
        }
    }

    /* yep, there is */
    if (have_spaces) {
        /* it's enough, at least one character will go, makes space for ending '\0' */
        new = malloc(strlen(set->val.str) * sizeof(char));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(local_mod->ctx), -1);
        new_used = 0;

        space_before = 0;
        for (i = 0; set->val.str[i]; ++i) {
            if (is_xmlws(set->val.str[i])) {
                if ((i == 0) || space_before) {
                    space_before = 1;
                    continue;
                } else {
                    space_before = 1;
                }
            } else {
                space_before = 0;
            }

            new[new_used] = (space_before ? ' ' : set->val.str[i]);
            ++new_used;
        }

        /* at worst there is one trailing space now */
        if (new_used && is_xmlws(new[new_used - 1])) {
            --new_used;
        }

        new = ly_realloc(new, (new_used + 1) * sizeof(char));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(local_mod->ctx), -1);
        new[new_used] = '\0';

        free(set->val.str);
        set->val.str = new;
    }

    return EXIT_SUCCESS;
}